

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegExp * re2c::repeat_from_to(RegExp *e,uint32_t n,uint32_t m)

{
  RegExp *pRVar1;
  RegExp *e1;
  RegExp *e2;
  undefined4 local_2c;
  RegExp *pRStack_28;
  uint32_t i;
  RegExp *r2;
  RegExp *r1;
  uint32_t m_local;
  uint32_t n_local;
  RegExp *e_local;
  
  pRVar1 = repeat(e,n);
  pRStack_28 = (RegExp *)0x0;
  for (local_2c = n; local_2c < m; local_2c = local_2c + 1) {
    e1 = (RegExp *)operator_new(8);
    NullOp::NullOp((NullOp *)e1);
    e2 = doCat(e,pRStack_28);
    pRStack_28 = mkAlt(e1,e2);
  }
  pRVar1 = doCat(pRVar1,pRStack_28);
  return pRVar1;
}

Assistant:

RegExp * repeat_from_to (RegExp * e, uint32_t n, uint32_t m)
{
	RegExp * r1 = repeat (e, n);
	RegExp * r2 = NULL;
	for (uint32_t i = n; i < m; ++i)
	{
		r2 = mkAlt (new NullOp, doCat (e, r2));
	}
	return doCat (r1, r2);
}